

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chars.cpp
# Opt level: O2

BuiltinFunction *
char_predicate(BuiltinFunction *__return_storage_ptr__,string *name,_func_int_int *fun)

{
  string *this;
  string local_40 [32];
  _func_int_int *local_20;
  
  std::__cxx11::string::string(local_40,(string *)name);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  ).
  super__Tuple_impl<1UL,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .
  super__Tuple_impl<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .
  super__Head_base<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>,_false>
  ._M_head_impl.super__Function_base._M_manager = (_Manager_type)0x0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  ).
  super__Tuple_impl<1UL,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .
  super__Tuple_impl<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .
  super__Head_base<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>,_false>
  ._M_head_impl._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)
   &(__return_storage_ptr__->
    super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
    ).
    super__Tuple_impl<1UL,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
    .
    super__Tuple_impl<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
    .
    super__Head_base<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>,_false>
    ._M_head_impl.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
           ).
           super__Tuple_impl<1UL,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
           .
           super__Tuple_impl<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
           .
           super__Head_base<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>,_false>
           ._M_head_impl.super__Function_base._M_functor + 8) = 0;
  local_20 = fun;
  this = (string *)operator_new(0x28);
  std::__cxx11::string::string(this,local_40);
  *(_func_int_int **)(this + 0x20) = local_20;
  *(string **)
   &(__return_storage_ptr__->
    super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
    ).
    super__Tuple_impl<1UL,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
    .
    super__Tuple_impl<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
    .
    super__Head_base<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>,_false>
    ._M_head_impl.super__Function_base._M_functor = this;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  ).
  super__Tuple_impl<1UL,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .
  super__Tuple_impl<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .
  super__Head_base<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>,_false>
  ._M_head_impl._M_invoker =
       std::
       _Function_handler<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kalinochkind[P]scheme/src/std/builtins/chars.cpp:6:19)>
       ::_M_invoke;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  ).
  super__Tuple_impl<1UL,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .
  super__Tuple_impl<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .
  super__Head_base<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>,_false>
  ._M_head_impl.super__Function_base._M_manager =
       std::
       _Function_handler<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kalinochkind[P]scheme/src/std/builtins/chars.cpp:6:19)>
       ::_M_manager;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  ).
  super__Tuple_impl<1UL,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .super__Head_base<1UL,_long_long,_false>._M_head_impl = 1;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  ).super__Head_base<0UL,_long_long,_false>._M_head_impl = 1;
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

static BuiltinFunction char_predicate(const std::string &name, int (*fun)(int))
{
    return {1, 1, [name, fun](const std::list<std::shared_ptr<SchemeObject>> &l) {
        auto p = std::dynamic_pointer_cast<SchemeChar>(l.front());
        if(!p)
            throw eval_error(name + ": a char required");
        return fun(p->value) ? scheme_true : scheme_false;
    }};
}